

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

fdb_status filemgr_does_file_exist(char *filename)

{
  fdb_status fVar1;
  filemgr_ops *pfVar2;
  
  pfVar2 = get_filemgr_ops();
  fVar1 = (*pfVar2->open)(filename,0,0x124);
  if (FDB_RESULT_INVALID_ARGS < fVar1) {
    (*pfVar2->close)(fVar1);
    fVar1 = FDB_RESULT_SUCCESS;
  }
  return fVar1;
}

Assistant:

fdb_status filemgr_does_file_exist(char *filename) {
    struct filemgr_ops *ops = get_filemgr_ops();
    int fd = ops->open(filename, O_RDONLY, 0444);
    if (fd < 0) {
        return (fdb_status) fd;
    }
    ops->close(fd);
    return FDB_RESULT_SUCCESS;
}